

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_qabs_s16_aarch64(CPUARMState_conflict *env,uint32_t x)

{
  anon_union_4_2_9473010e aVar1;
  anon_union_4_2_9473010e conv_u_1;
  anon_union_4_2_9473010e conv_u;
  neon_s16 vec;
  uint32_t x_local;
  CPUARMState_conflict *env_local;
  
  conv_u_1.v.v1 = (int16_t)x;
  conv_u_1.v.v2 = (int16_t)(x >> 0x10);
  if (conv_u_1.v.v1 == -0x8000) {
    conv_u_1.v.v1 = 0x7fff;
    (env->vfp).qc[0] = 1;
    aVar1 = conv_u_1;
  }
  else {
    aVar1.i = x;
    if (conv_u_1.v.v1 < 0) {
      conv_u_1.v.v1 = -conv_u_1.v.v1;
      aVar1 = conv_u_1;
    }
  }
  conv_u_1 = aVar1;
  if (conv_u_1.v.v2 == -0x8000) {
    conv_u_1.v.v2 = 0x7fff;
    (env->vfp).qc[0] = 1;
  }
  else if ((int)conv_u_1.i < 0) {
    conv_u_1.v.v2 = -conv_u_1.v.v2;
  }
  return conv_u_1.i;
}

Assistant:

uint32_t HELPER(neon_qabs_s16)(CPUARMState *env, uint32_t x)
{
    neon_s16 vec;
    NEON_UNPACK(neon_s16, vec, x);
    DO_QABS16(vec.v1);
    DO_QABS16(vec.v2);
    NEON_PACK(neon_s16, x, vec);
    return x;
}